

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_dist.cpp
# Opt level: O0

LOs __thiscall Omega_h::Dist::items2dest_idxs(Dist *this)

{
  LO size_in;
  void *extraout_RDX;
  Dist *in_RSI;
  LOs LVar1;
  allocator local_e9;
  string local_e8 [48];
  Read<int> local_b8;
  undefined1 local_a8 [8];
  Dist inverse;
  Dist *this_local;
  
  invert((Dist *)local_a8,in_RSI);
  size_in = ndests(in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"",&local_e9);
  Read<int>::Read(&local_b8,size_in,0,1,(string *)local_e8);
  exch<int>(this,(Read<int> *)local_a8,(Int)&local_b8);
  Read<int>::~Read(&local_b8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  ~Dist((Dist *)local_a8);
  LVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar1.write_.shared_alloc_;
}

Assistant:

LOs Dist::items2dest_idxs() const {
  auto inverse = invert();
  return inverse.exch(LOs(ndests(), 0, 1), 1);
}